

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SetTabItemClosed(char *label)

{
  ImU32 tab_id_00;
  ImGuiID tab_id;
  ImGuiTabBar *tab_bar;
  bool is_within_manual_tab_bar;
  ImGuiContext *g;
  byte local_25;
  ImGuiTabBar *tab_bar_00;
  undefined7 in_stack_ffffffffffffffe8;
  
  local_25 = 0;
  if (GImGui->CurrentTabBar != (ImGuiTabBar *)0x0) {
    local_25 = (GImGui->CurrentTabBar->Flags & 0x100000U) != 0 ^ 0xff;
  }
  if ((local_25 & 1) != 0) {
    tab_bar_00 = GImGui->CurrentTabBar;
    if ((tab_bar_00->WantLayout & 1U) == 0) {
      __assert_fail("tab_bar->WantLayout",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0x1c76,"void ImGui::SetTabItemClosed(const char *)");
    }
    tab_id_00 = TabBarCalcTabID((ImGuiTabBar *)
                                (CONCAT17(local_25,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff),
                                (char *)tab_bar_00);
    TabBarRemoveTab(tab_bar_00,tab_id_00);
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        IM_ASSERT(tab_bar->WantLayout);         // Needs to be called AFTER BeginTabBar() and BEFORE the first call to BeginTabItem()
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label);
        TabBarRemoveTab(tab_bar, tab_id);
    }
}